

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O1

void __thiscall
QFutureInterfaceBasePrivate::~QFutureInterfaceBasePrivate(QFutureInterfaceBasePrivate *this)

{
  ProgressData *pPVar1;
  Data *pDVar2;
  _Manager_type p_Var3;
  Data *pDVar4;
  
  if (this->hasException == true) {
    if ((this->data).m_results._vptr_ResultStoreBase != (_func_int **)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
  }
  else {
    QtPrivate::ResultStoreBase::~ResultStoreBase(&(this->data).m_results);
  }
  pPVar1 = (this->m_progress).d;
  if (pPVar1 != (ProgressData *)0x0) {
    pDVar2 = (pPVar1->text).d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((pPVar1->text).d.d)->super_QArrayData,2,0x10);
      }
    }
    operator_delete(pPVar1,0x20);
  }
  p_Var3 = (this->continuation).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->continuation,(_Any_data *)&this->continuation,__destroy_functor);
  }
  QWaitCondition::~QWaitCondition(&this->pausedWaitCondition);
  QWaitCondition::~QWaitCondition(&this->waitCondition);
  pDVar4 = (this->outputConnections).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->outputConnections).d.d)->super_QArrayData,8,0x10);
    }
  }
  QMutex::~QMutex(&this->m_mutex);
  return;
}

Assistant:

QFutureInterfaceBasePrivate::~QFutureInterfaceBasePrivate()
{
    if (hasException)
        data.m_exceptionStore.~ExceptionStore();
    else
        data.m_results.~ResultStoreBase();
}